

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O0

void UpsampleRgb565LinePair_C
               (uint8_t *top_y,uint8_t *bottom_y,uint8_t *top_u,uint8_t *top_v,uint8_t *cur_u,
               uint8_t *cur_v,uint8_t *top_dst,uint8_t *bottom_dst,int len)

{
  byte *in_RCX;
  byte *in_RDX;
  long in_RSI;
  byte *in_R8;
  byte *in_R9;
  uint32_t uv0_5;
  uint32_t uv0_4;
  uint32_t uv1_1;
  uint32_t uv0_3;
  uint32_t uv1;
  uint32_t uv0_2;
  uint32_t diag_03;
  uint32_t diag_12;
  uint32_t avg;
  uint32_t uv;
  uint32_t t_uv;
  uint32_t uv0_1;
  uint32_t uv0;
  uint32_t l_uv;
  uint32_t tl_uv;
  int last_pixel_pair;
  int x;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint local_40;
  uint local_3c;
  int local_34;
  
  local_3c = (uint)*in_RDX | (uint)*in_RCX << 0x10;
  local_40 = (uint)*in_R8 | (uint)*in_R9 << 0x10;
  VP8YuvToRgb565(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (in_RSI != 0) {
    VP8YuvToRgb565(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  for (local_34 = 1; local_34 <= (int)(uv0_2 - 1) >> 1; local_34 = local_34 + 1) {
    in_stack_ffffffffffffffb4 = (uint)in_RDX[local_34] | (uint)in_RCX[local_34] << 0x10;
    in_stack_ffffffffffffffb0 = (uint)in_R8[local_34] | (uint)in_R9[local_34] << 0x10;
    in_stack_ffffffffffffffac =
         local_3c + in_stack_ffffffffffffffb4 + local_40 + in_stack_ffffffffffffffb0 + 0x80008;
    in_stack_ffffffffffffffa4 =
         in_stack_ffffffffffffffac + (local_3c + in_stack_ffffffffffffffb0) * 2 >> 3;
    in_stack_ffffffffffffffa0 =
         (in_stack_ffffffffffffffac + (in_stack_ffffffffffffffb4 + local_40) * 2 >> 3) + local_3c >>
         1;
    VP8YuvToRgb565(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    VP8YuvToRgb565(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (in_RSI != 0) {
      VP8YuvToRgb565(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      VP8YuvToRgb565(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    local_40 = in_stack_ffffffffffffffb0;
    local_3c = in_stack_ffffffffffffffb4;
  }
  if (((uv0_2 & 1) == 0) &&
     (VP8YuvToRgb565(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
     in_RSI != 0)) {
    VP8YuvToRgb565(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  return;
}

Assistant:

static void EmptyUpsampleFunc(const uint8_t* top_y, const uint8_t* bottom_y,
                              const uint8_t* top_u, const uint8_t* top_v,
                              const uint8_t* cur_u, const uint8_t* cur_v,
                              uint8_t* top_dst, uint8_t* bottom_dst, int len) {
  (void)top_y;
  (void)bottom_y;
  (void)top_u;
  (void)top_v;
  (void)cur_u;
  (void)cur_v;
  (void)top_dst;
  (void)bottom_dst;
  (void)len;
  assert(0);   // COLORSPACE SUPPORT NOT COMPILED
}